

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O3

void __thiscall
Imf_3_4::anon_unknown_6::ScanLineProcess::run_fill
          (ScanLineProcess *this,FrameBuffer *outfb,int fbY,
          vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  int iVar1;
  pointer pSVar2;
  pointer pSVar3;
  char cVar4;
  ushort uVar5;
  ArgExc *this_00;
  float fVar6;
  uint uVar7;
  undefined4 in_register_00000014;
  pointer *ppSVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  float *pfVar14;
  float *pfVar15;
  
  ppSVar8 = (pointer *)CONCAT44(in_register_00000014,fbY);
  iVar11 = (int)outfb;
  do {
    if ((vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *)ppSVar8 == filllist) {
      return;
    }
    iVar9 = ((this->cinfo).height + (this->cinfo).start_y) - (this->decoder).user_line_end_ignore;
    if (iVar11 < iVar9) {
      pSVar2 = ppSVar8[2];
      pSVar3 = (((vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *)(ppSVar8 + 3))->
               super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar14 = (float *)((long)&ppSVar8[1]->type +
                         (long)(iVar11 / *(int *)((long)ppSVar8 + 0x24)) * (long)pSVar3 +
                         (long)((this->cinfo).start_x / *(int *)(ppSVar8 + 4)) * (long)pSVar2);
      iVar12 = iVar11;
      do {
        if (iVar12 % *(int *)((long)ppSVar8 + 0x24) == 0) {
          iVar10 = (this->cinfo).width;
          if (0 < iVar10) {
            iVar13 = (this->cinfo).start_x;
            iVar10 = iVar10 + iVar13;
            pfVar15 = pfVar14;
            do {
              if (iVar13 % *(int *)(ppSVar8 + 4) == 0) {
                iVar1 = *(int *)ppSVar8;
                if (iVar1 == 2) {
                  *pfVar15 = (float)(double)ppSVar8[5];
                }
                else if (iVar1 == 1) {
                  fVar6 = ABS((float)(double)ppSVar8[5]);
                  uVar5 = (ushort)((uint)(float)(double)ppSVar8[5] >> 0x10) & 0x8000;
                  if ((uint)fVar6 < 0x38800000) {
                    if ((0x33000000 < (uint)fVar6) &&
                       (uVar7 = (uint)fVar6 & 0x7fffff | 0x800000,
                       cVar4 = (char)((uint)fVar6 >> 0x17),
                       uVar5 = uVar5 | (ushort)(uVar7 >> (0x7eU - cVar4 & 0x1f)),
                       0x80000000 < uVar7 << (cVar4 + 0xa2U & 0x1f))) {
                      uVar5 = uVar5 + 1;
                    }
                  }
                  else if ((uint)fVar6 < 0x7f800000) {
                    if ((uint)fVar6 < 0x477ff000) {
                      uVar5 = (ushort)((int)fVar6 + 0x8000fff +
                                       (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd) | uVar5;
                    }
                    else {
                      uVar5 = uVar5 | 0x7c00;
                    }
                  }
                  else {
                    uVar5 = uVar5 | 0x7c00;
                    if (fVar6 != INFINITY) {
                      uVar7 = (uint)fVar6 >> 0xd & 0x3ff;
                      uVar5 = uVar5 | (ushort)uVar7 | (ushort)(uVar7 == 0);
                    }
                  }
                  *(ushort *)pfVar15 = uVar5;
                }
                else {
                  if (iVar1 != 0) {
                    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
                    Iex_3_4::ArgExc::ArgExc(this_00,"Unknown pixel data type.");
                    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
                  }
                  *pfVar15 = (float)(long)(double)ppSVar8[5];
                }
                pfVar15 = (float *)((long)&pSVar2->type + (long)pfVar15);
              }
              iVar13 = iVar13 + 1;
            } while (iVar13 < iVar10);
          }
          pfVar14 = (float *)((long)pfVar14 + (long)pSVar3);
        }
        iVar12 = iVar12 + 1;
      } while (iVar12 < iVar9);
    }
    ppSVar8 = ppSVar8 + 7;
  } while( true );
}

Assistant:

void ScanLineProcess::run_fill (
    const FrameBuffer *outfb,
    int fbY,
    const std::vector<Slice> &filllist)
{
    for (auto& s: filllist)
    {
        uint8_t*       ptr;

        ptr  = reinterpret_cast<uint8_t*> (s.base);
        ptr += int64_t (cinfo.start_x / s.xSampling) * int64_t (s.xStride);
        ptr += int64_t (fbY / s.ySampling) * int64_t (s.yStride);

        // TODO: update ImfMisc, lift fill type / value
        int stop = cinfo.start_y + cinfo.height - decoder.user_line_end_ignore;
        for ( int start = fbY; start < stop; ++start )
        {
            if (start % s.ySampling) continue;

            uint8_t* outptr = ptr;
            for ( int sx = cinfo.start_x, ex = cinfo.start_x + cinfo.width;
                  sx < ex; ++sx )
            {
                if (sx % s.xSampling) continue;

                switch (s.type)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    {
                        unsigned int fillVal = (unsigned int) (s.fillValue);
                        *(unsigned int*)outptr = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    {
                        half fillVal = half (s.fillValue);
                        *(half*)outptr = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    {
                        float fillVal = float (s.fillValue);
                        *(float*)outptr = fillVal;
                        break;
                    }
                    default:
                        throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
                }
                outptr += s.xStride;
            }

            ptr += s.yStride;
        }
    }
}